

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btMultiBodyLinkCollider_*>::~btAlignedObjectArray
          (btAlignedObjectArray<btMultiBodyLinkCollider_*> *this)

{
  if ((this->m_data != (btMultiBodyLinkCollider **)0x0) && (this->m_ownsMemory == true)) {
    btAlignedFreeInternal(this->m_data);
  }
  this->m_ownsMemory = true;
  this->m_data = (btMultiBodyLinkCollider **)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}